

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_append_ctx(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint __fd;
  void *__buf;
  void *__buf_00;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  bson_t *pbVar11;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar12;
  bson_t bcon;
  bson_t expected;
  bson_t child;
  undefined8 uStack_68d0;
  uint8_t *puStack_68c8;
  undefined1 *puStack_68c0;
  undefined1 auStack_68b0 [8];
  void *pvStack_68a8;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  char *pcStack_6888;
  undefined8 uStack_6870;
  undefined1 auStack_6800 [25944];
  void *pvStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  code *pcStack_288;
  bson_t local_280;
  undefined1 local_200 [4];
  uint local_1fc;
  undefined1 local_180 [336];
  
  pbVar11 = &local_280;
  pcStack_288 = (code *)0x13c0ed;
  bson_init(&local_280);
  pcStack_288 = (code *)0x13c0fd;
  bson_init(local_200);
  pcStack_288 = (code *)0x13c10d;
  bson_init(local_180);
  pcStack_288 = (code *)0x13c12e;
  bson_append_utf8(local_180,"c",0xffffffff,"d",0xffffffff);
  pcStack_288 = (code *)0x13c155;
  bson_append_utf8(local_180,"e",0xffffffff,"f",0xffffffff);
  pcStack_288 = (code *)0x13c16f;
  bson_append_document(local_200,"a",0xffffffff,local_180);
  pcVar10 = "e";
  pcStack_290 = (char *)0x0;
  pcStack_298 = "}";
  pcStack_2a0 = "f";
  pvStack_2a8 = (void *)0x13c1a4;
  test_append_ctx_helper(&local_280,"a","{",0,"add magic");
  pcStack_288 = (code *)0x13c1b3;
  __buf = (void *)bson_get_data(&local_280);
  pcStack_288 = (code *)0x13c1be;
  __buf_00 = (void *)bson_get_data(local_200);
  if (local_1fc == local_280.len) {
    pcStack_288 = (code *)0x13c1dc;
    pvVar3 = (void *)bson_get_data(local_200);
    pcStack_288 = (code *)0x13c1e7;
    pvVar4 = (void *)bson_get_data(&local_280);
    pcStack_288 = (code *)0x13c1f6;
    iVar1 = bcmp(pvVar3,pvVar4,(ulong)local_1fc);
    if (iVar1 == 0) {
      pcStack_288 = (code *)0x13c202;
      bson_destroy(&local_280);
      pcStack_288 = (code *)0x13c20f;
      bson_destroy(local_200);
      pcStack_288 = (code *)0x13c21c;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_288 = (code *)0x13c238;
  uVar5 = bson_as_canonical_extended_json(&local_280,0);
  pcStack_288 = (code *)0x13c24d;
  uVar6 = bson_as_canonical_extended_json(local_200,0);
  uVar7 = local_1fc;
  if (local_280.len < local_1fc) {
    uVar7 = local_280.len;
  }
  if (uVar7 != 0) {
    uVar7 = local_1fc;
    if (local_280.len <= local_1fc) {
      uVar7 = local_280.len;
    }
    uVar8 = 0;
    do {
      if (*(char *)((long)__buf + uVar8) != *(char *)((long)__buf_00 + uVar8)) {
        uVar8 = uVar8 & 0xffffffff;
        goto LAB_0013c288;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != (uint)uVar8);
  }
  uVar2 = local_280.len;
  if (local_280.len < local_1fc) {
    uVar2 = local_1fc;
  }
  uVar8 = (ulong)(uVar2 - 1);
LAB_0013c288:
  pcStack_288 = (code *)0x13c2a6;
  uVar12 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
  pcStack_288 = (code *)0x13c2be;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar9 = "failure.expected.bson";
  pvVar3 = (void *)0x42;
  pcStack_288 = (code *)0x13c2d9;
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c325:
    pcStack_288 = (code *)0x13c32a;
    test_append_ctx_cold_5();
LAB_0013c32a:
    pcStack_288 = (code *)0x13c32f;
    test_append_ctx_cold_4();
  }
  else {
    pbVar11 = (bson_t *)(ulong)__fd;
    if (__fd == 0xffffffff) goto LAB_0013c32a;
    pcVar9 = (char *)(ulong)uVar2;
    pcStack_288 = (code *)0x13c2fa;
    pvVar3 = __buf;
    uVar8 = write(uVar2,__buf,(ulong)local_280.len);
    if (uVar8 == local_280.len) {
      __buf = (void *)(ulong)local_1fc;
      pcStack_288 = (code *)0x13c315;
      pvVar3 = __buf_00;
      pcVar9 = (char *)pbVar11;
      pvVar4 = (void *)write(__fd,__buf_00,(size_t)__buf);
      if (pvVar4 != __buf) goto LAB_0013c334;
      pvVar3 = (void *)(ulong)__fd;
      pcStack_288 = (code *)0x13c325;
      pcVar9 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013c325;
    }
  }
  pcStack_288 = (code *)0x13c334;
  test_append_ctx_cold_1();
LAB_0013c334:
  pcStack_288 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_68c0 = auStack_68b0;
  if (extraout_AL != '\0') {
    uStack_6870 = uVar12;
  }
  pvStack_68a8 = pvVar3;
  uStack_6898 = uVar5;
  uStack_6890 = uVar6;
  pcStack_6888 = pcVar10;
  pvStack_2a8 = __buf_00;
  pcStack_2a0 = (char *)pbVar11;
  pcStack_298 = (char *)__buf;
  pcStack_290 = (char *)(ulong)uVar2;
  pcStack_288 = (code *)&stack0xfffffffffffffff8;
  bcon_append_ctx_init(auStack_6800);
  puStack_68c8 = local_280.padding;
  uStack_68d0 = 0x3000000008;
  bcon_append_ctx_va(pcVar9,auStack_6800,&uStack_68d0);
  if ((uint)uStack_68d0 < 0x29) {
    uStack_68d0 = CONCAT44(uStack_68d0._4_4_,(uint)uStack_68d0 + 8);
  }
  else {
    puStack_68c8 = puStack_68c8 + 8;
  }
  bcon_append_ctx(pcVar9,auStack_6800,"c","d",0);
  bcon_append_ctx_va(pcVar9,auStack_6800,&uStack_68d0);
  return;
}

Assistant:

static void
test_append_ctx (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "c", -1, "d", -1);
   bson_append_utf8 (&child, "e", -1, "f", -1);

   bson_append_document (&expected, "a", -1, &child);

   test_append_ctx_helper (
      &bcon, "a", "{", NULL, "add magic", "e", "f", "}", NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&child);
}